

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

stacktrace *
cpptrace::generate_trace(stacktrace *__return_storage_ptr__,size_t skip,size_t max_depth)

{
  bool bVar1;
  string local_a0;
  reference local_80;
  stacktrace_frame *frame;
  iterator __end2;
  iterator __begin2;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *__range2;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> trace;
  undefined1 local_38 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> frames;
  size_t max_depth_local;
  size_t skip_local;
  
  frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)max_depth;
  detail::capture_frames
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,skip + 1,max_depth);
  detail::resolve_frames
            ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             &__range2,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  __end2 = std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
           begin((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
                 &__range2);
  frame = (stacktrace_frame *)
          std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::end
                    ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                      *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
                                *)&frame);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
               ::operator*(&__end2);
    detail::demangle(&local_a0,&local_80->symbol);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_80->symbol,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    __gnu_cxx::
    __normal_iterator<cpptrace::stacktrace_frame_*,_std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>_>
    ::operator++(&__end2);
  }
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::vector
            (&__return_storage_ptr__->frames,
             (vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             &__range2);
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
            ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             &__range2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

CPPTRACE_FORCE_NO_INLINE
    stacktrace generate_trace(std::size_t skip, std::size_t max_depth) {
        try {
            std::vector<frame_ptr> frames = detail::capture_frames(skip + 1, max_depth);
            std::vector<stacktrace_frame> trace = detail::resolve_frames(frames);
            for(auto& frame : trace) {
                frame.symbol = detail::demangle(frame.symbol);
            }
            return {std::move(trace)};
        } catch(...) { // NOSONAR
            if(!detail::should_absorb_trace_exceptions()) {
                throw;
            }
            return stacktrace();
        }
    }